

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.hpp
# Opt level: O0

void __thiscall
helics::CustomTranslatorOperator::~CustomTranslatorOperator(CustomTranslatorOperator *this)

{
  CustomTranslatorOperator *in_RDI;
  
  ~CustomTranslatorOperator(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

CustomTranslatorOperator() = default;